

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

MemoryRegionSection *
section_from_flat_range(MemoryRegionSection *__return_storage_ptr__,FlatRange *fr,FlatView *fv)

{
  undefined8 uVar1;
  undefined1 a [16];
  Int128 IVar2;
  undefined8 unaff_RBX;
  undefined8 unaff_R14;
  
  uVar1 = *(undefined8 *)((long)&(fr->addr).size + 8);
  *(long *)&__return_storage_ptr__->size = (long)(fr->addr).size;
  *(undefined8 *)((long)&__return_storage_ptr__->size + 8) = uVar1;
  __return_storage_ptr__->mr = fr->mr;
  __return_storage_ptr__->fv = fv;
  __return_storage_ptr__->offset_within_region = fr->offset_in_region;
  IVar2 = (fr->addr).start;
  a._8_8_ = unaff_R14;
  a._0_8_ = unaff_RBX;
  int128_get64((Int128)a);
  __return_storage_ptr__->offset_within_address_space = (hwaddr)IVar2;
  __return_storage_ptr__->readonly = fr->readonly;
  return __return_storage_ptr__;
}

Assistant:

static inline MemoryRegionSection
section_from_flat_range(FlatRange *fr, FlatView *fv)
{
    return (MemoryRegionSection) {
        .mr = fr->mr,
        .fv = fv,
        .offset_within_region = fr->offset_in_region,
        .size = fr->addr.size,
        .offset_within_address_space = int128_get64(fr->addr.start),
        .readonly = fr->readonly,
    };
}